

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O2

void __thiscall
agge::tests::GenericRGBXBlenderTests::AlphaIsMixedFromSrcAlphaAndCover
          (GenericRGBXBlenderTests *this)

{
  color cVar1;
  long lVar2;
  allocator local_b5;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba> b2;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba> b1;
  uint8_t covers [4];
  string local_a0;
  LocationInfo local_80;
  pixel dest2 [4];
  pixel dest1 [4];
  pixel reference2 [4];
  pixel reference1 [4];
  
  covers[0] = '\x10';
  covers[1] = 0x90;
  covers[2] = 0xa0;
  covers[3] = 0xd0;
  cVar1 = color::make(0x80,0x80,0x80,'0');
  b1._color._0_2_ = cVar1._0_2_;
  b1._color.b = cVar1.b;
  b1._color.a = cVar1.a;
  b1._a = (((uint)cVar1 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar1 >> 0x18) * 0x40;
  cVar1 = color::make(0x80,0x80,0x80,0xc0);
  b2._color._0_2_ = cVar1._0_2_;
  b2._color.b = cVar1.b;
  b2._color.a = cVar1.a;
  b2._a = (((uint)cVar1 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar1 >> 0x18) * 0x40;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    *(undefined4 *)(dest1[0].components + lVar2) = 0x80e08020;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    *(undefined4 *)(dest2[0].components + lVar2) = 0x80e08020;
  }
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&b1,dest1,0,0,4,covers);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&b2,dest2,0,0,4,covers);
  reference1[0].components[0] = '!';
  reference1[0].components[1] = 0x80;
  reference1[0].components[2] = 0xde;
  reference1[0].components[3] = '\0';
  reference1[1].components[0] = '*';
  reference1[1].components[1] = 0x80;
  reference1[1].components[2] = 0xd5;
  reference1[1].components[3] = '\0';
  reference1[2].components[0] = '+';
  reference1[2].components[1] = 0x80;
  reference1[2].components[2] = 0xd4;
  reference1[2].components[3] = '\0';
  reference1[3].components[0] = '.';
  reference1[3].components[1] = 0x80;
  reference1[3].components[2] = 0xd1;
  reference1[3].components[3] = '\0';
  reference2[0].components[0] = '$';
  reference2[0].components[1] = 0x80;
  reference2[0].components[2] = 0xdb;
  reference2[0].components[3] = '\0';
  reference2[1].components[0] = 'H';
  reference2[1].components[1] = 0x80;
  reference2[1].components[2] = 0xb7;
  reference2[1].components[3] = '\0';
  reference2[2].components[0] = 'M';
  reference2[2].components[1] = 0x80;
  reference2[2].components[2] = 0xb2;
  reference2[2].components[3] = '\0';
  reference2[3].components[0] = 'Z';
  reference2[3].components[1] = 0x80;
  reference2[3].components[2] = 0xa5;
  reference2[3].components[3] = '\0';
  std::__cxx11::string::string
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_b5);
  ut::LocationInfo::LocationInfo(&local_80,&local_a0,0xee);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,4ul>
            (&reference1,&dest1,&local_80);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_b5);
  ut::LocationInfo::LocationInfo(&local_80,&local_a0,0xef);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,4ul>
            (&reference2,&dest2,&local_80);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( AlphaIsMixedFromSrcAlphaAndCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 4;
				const pixel back = { { 0x20, 0x80, 0xE0, 0x80 } };
				const uint8_t covers[n] = { 0x10, 0x90, 0xA0, 0xD0, };
				blender_solid_color_rgb<pixel, order_rgba> b1(color::make(0x80, 0x80, 0x80, 0x30));
				blender_solid_color_rgb<pixel, order_rgba> b2(color::make(0x80, 0x80, 0x80, 0xC0));
				pixel dest1[n];
				pixel dest2[n];

				fill_n(dest1, n, back);
				fill_n(dest2, n, back);

				// ACT
				b1(dest1, 0, 0, n, covers);
				b2(dest2, 0, 0, n, covers);

				// ASSERT
				pixel reference1[] = {
					{ { 0x21, 0x80, 0xDE, } },
					{ { 0x2A, 0x80, 0xD5, } },
					{ { 0x2B, 0x80, 0xD4, } },
					{ { 0x2E, 0x80, 0xD1, } },
				};
				pixel reference2[] = {
					{ { 0x24, 0x80, 0xDB, } },
					{ { 0x48, 0x80, 0xB7, } },
					{ { 0x4D, 0x80, 0xB2, } },
					{ { 0x5A, 0x80, 0xA5, } },
				};

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
			}